

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosComm.cpp
# Opt level: O1

Status * __thiscall
adios2::helper::Comm::Req::Wait(Status *__return_storage_ptr__,Req *this,string *hint)

{
  _Head_base<0UL,_adios2::helper::CommReqImpl_*,_false> _Var1;
  int local_30;
  int iStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  bool local_20;
  
  __return_storage_ptr__->Source = -1;
  __return_storage_ptr__->Tag = -1;
  __return_storage_ptr__->Count = 0;
  __return_storage_ptr__->Cancelled = false;
  _Var1._M_head_impl =
       (this->m_Impl)._M_t.
       super___uniq_ptr_impl<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
       ._M_t.
       super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
       .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (CommReqImpl *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_CommReqImpl[2])(&local_30);
    __return_storage_ptr__->Cancelled = local_20;
    __return_storage_ptr__->Source = local_30;
    __return_storage_ptr__->Tag = iStack_2c;
    *(undefined4 *)&__return_storage_ptr__->Count = uStack_28;
    *(undefined4 *)((long)&__return_storage_ptr__->Count + 4) = uStack_24;
    _Var1._M_head_impl =
         (this->m_Impl)._M_t.
         super___uniq_ptr_impl<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
         .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl;
    (this->m_Impl)._M_t.
    super___uniq_ptr_impl<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
    .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl = (CommReqImpl *)0x0;
    if (_Var1._M_head_impl != (CommReqImpl *)0x0) {
      (*(_Var1._M_head_impl)->_vptr_CommReqImpl[1])();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Comm::Status Comm::Req::Wait(const std::string &hint)
{
    Comm::Status status;
    if (m_Impl)
    {
        status = m_Impl->Wait(hint);
        m_Impl.reset();
    }
    return status;
}